

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.hpp
# Opt level: O3

void trial::protocol::serialization::
     load_overloader<trial::protocol::bintoken::iarchive,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>,_void>
     ::load(iarchive *ar,
           array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
           *data,uint protocol_version)

{
  bool bVar1;
  error *this;
  bool bVar2;
  long lVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> value;
  size_t count;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  unsigned_long local_38;
  
  bintoken::iarchive::load<trial::protocol::bintoken::token::begin_array>(ar);
  bintoken::iarchive::load<unsigned_long>(ar,&local_38);
  if (local_38 == 2) {
    lVar3 = 0;
    bVar1 = true;
    do {
      bVar2 = bVar1;
      local_58._M_string_length = 0;
      local_58.field_2._M_local_buf[0] = '\0';
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      bintoken::iarchive::load<std::__cxx11::string>(ar,&local_58);
      std::__cxx11::string::_M_assign((string *)(data->_M_elems + lVar3));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,
                        CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                 local_58.field_2._M_local_buf[0]) + 1);
      }
      lVar3 = 1;
      bVar1 = false;
    } while (bVar2);
    if ((ar->reader).decoder.current.code == end_array) {
      bintoken::iarchive::load<trial::protocol::bintoken::token::end_array>(ar);
      return;
    }
    this = (error *)__cxa_allocate_exception(0x20);
    bintoken::error::error(this,expected_end_array);
  }
  else {
    this = (error *)__cxa_allocate_exception(0x20);
    bintoken::error::error(this,incompatible_type);
  }
  __cxa_throw(this,&bintoken::error::typeinfo,std::system_error::~system_error);
}

Assistant:

static void load(protocol::bintoken::iarchive& ar,
                     std::array<T, N>& data,
                     const unsigned int protocol_version)
    {
        ar.load<bintoken::token::begin_array>();

        std::size_t count;
        ar.load_override(count, protocol_version);
        if (count != N)
            throw bintoken::error(bintoken::incompatible_type);

        for (std::size_t i = 0; i < N; ++i)
        {
            T value;
            ar >> value;
            data[i] = value;
        }
        if (!ar.at<bintoken::token::end_array>())
            throw bintoken::error(bintoken::expected_end_array);
        ar.load<bintoken::token::end_array>();
    }